

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Value * __thiscall
soul::Value::tryCastToType(Value *__return_storage_ptr__,Value *this,Type *destType)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  CastType CVar4;
  bool bVar5;
  Type t;
  Type local_90;
  Type local_78;
  PackedData local_60;
  PackedData local_48;
  
  bVar2 = Type::isEqual(destType,&this->type,0);
  if (bVar2) {
    Value(__return_storage_ptr__,this);
  }
  else {
    CVar4 = TypeRules::getCastType(destType,&this->type);
    if (CVar4 != notPossible) {
      bVar2 = destType->category != array;
      bVar5 = destType->boundingSize != 0;
      if (bVar5 || bVar2) {
        bVar3 = false;
      }
      else {
        uVar1._0_1_ = destType->category;
        uVar1._1_1_ = destType->arrayElementCategory;
        uVar1._2_1_ = destType->isRef;
        uVar1._3_1_ = destType->isConstant;
        local_78.primitiveType.type = (destType->primitiveType).type;
        local_78.boundingSize = destType->boundingSize;
        local_78.arrayElementBoundingSize = destType->arrayElementBoundingSize;
        local_78.structure.object = (destType->structure).object;
        if (local_78.structure.object != (Structure *)0x0) {
          ((local_78.structure.object)->super_RefCountedObject).refCount =
               ((local_78.structure.object)->super_RefCountedObject).refCount + 1;
        }
        local_78._0_4_ = uVar1 & 0xffffff;
        bVar3 = Type::isEqual(&local_78,&this->type,0);
        bVar3 = !bVar3;
      }
      if (!bVar5 && !bVar2) {
        RefCountedPtr<soul::Structure>::decIfNotNull(local_78.structure.object);
      }
      if (!bVar3) {
        local_90.category = destType->category;
        local_90.arrayElementCategory = destType->arrayElementCategory;
        local_90.isRef = destType->isRef;
        local_90.isConstant = destType->isConstant;
        local_90.primitiveType.type = (destType->primitiveType).type;
        local_90.boundingSize = destType->boundingSize;
        local_90.arrayElementBoundingSize = destType->arrayElementBoundingSize;
        local_90.structure.object = (destType->structure).object;
        if (local_90.structure.object != (Structure *)0x0) {
          ((local_90.structure.object)->super_RefCountedObject).refCount =
               ((local_90.structure.object)->super_RefCountedObject).refCount + 1;
        }
        Value(__return_storage_ptr__,&local_90);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_90.structure.object);
        getData(&local_48,__return_storage_ptr__);
        getData(&local_60,this);
        PackedData::setFrom(&local_48,&local_60);
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = 0;
    (__return_storage_ptr__->type).category = invalid;
    (__return_storage_ptr__->type).arrayElementCategory = invalid;
    (__return_storage_ptr__->type).isRef = false;
    (__return_storage_ptr__->type).isConstant = false;
    (__return_storage_ptr__->type).primitiveType = invalid;
    (__return_storage_ptr__->type).boundingSize = 0;
    (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.items =
         (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
    (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::tryCastToType (const Type& destType) const
{
    if (destType.isIdentical (type))
        return *this;

    if (! TypeRules::canCastTo (destType, type))
        return {};

    if (destType.isUnsizedArray()
          && ! destType.removeConstIfPresent().isIdentical (type))
        return {};

    Value v (destType);
    v.getData().setFrom (getData());
    return v;
}